

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeEncodingSynapse.cpp
# Opt level: O1

void __thiscall
BSA_SpikeEncodingSynapse::BSA_SpikeEncodingSynapse
          (BSA_SpikeEncodingSynapse *this,Population *n_from,Population *n_to)

{
  BSA_SpikeEncodingSynapse_param *pBVar1;
  
  (this->super_Synapse)._vptr_Synapse = (_func_int **)&PTR_update_0012ad20;
  pBVar1 = (BSA_SpikeEncodingSynapse_param *)operator_new(0x20);
  pBVar1->filter_length = 24.0;
  pBVar1->threshold = 0.955;
  pBVar1->scale = 1.0;
  pBVar1->window = HAMMING;
  this->param = pBVar1;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->input).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->input).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->input).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->spikes).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->spikes).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spikes).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  initialize(this,n_from,n_to);
  return;
}

Assistant:

BSA_SpikeEncodingSynapse::BSA_SpikeEncodingSynapse(Population* n_from, Population* n_to) : 
    param(new BSA_SpikeEncodingSynapse_param)
{
    initialize(n_from, n_to);
}